

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itrender.c
# Opt level: O0

int dumb_it_scan_for_playable_orders
              (DUMB_IT_SIGDATA *sigdata,dumb_scan_callback callback,void *callback_data)

{
  int iVar1;
  int32 iVar2;
  void *array;
  DUMB_IT_SIGRENDERER *pDVar3;
  void *in_RDX;
  code *in_RSI;
  double in_RDI;
  int32 l;
  DUMB_IT_SIGRENDERER *sigrenderer;
  void *ba_played;
  int32 length;
  int n;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffd8;
  int iVar4;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((*(int *)((long)in_RDI + 0x50) == 0) || (*(long *)((long)in_RDI + 0x100) == 0)) ||
     (array = bit_array_create(CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)),
     array == (void *)0x0)) {
    return -1;
  }
  for (iVar4 = 1; iVar4 < *(int *)((long)in_RDI + 0x50); iVar4 = iVar4 + 1) {
    if ((*(int *)((long)in_RDI + 0x5c) <=
         (int)(uint)*(byte *)(*(long *)((long)in_RDI + 0x100) + (long)iVar4)) ||
       (iVar1 = is_pattern_silent((IT_PATTERN *)
                                  (*(long *)((long)in_RDI + 0x120) +
                                  (ulong)*(byte *)(*(long *)((long)in_RDI + 0x100) + (long)iVar4) *
                                  0x10),iVar4), 1 < iVar1)) {
      bit_array_set(array,(long)(iVar4 << 8));
    }
  }
  do {
    iVar4 = 0;
    while ((iVar4 < *(int *)((long)in_RDI + 0x50) &&
           (iVar1 = bit_array_test_range(array,(long)(iVar4 << 8),0x100), iVar1 != 0))) {
      iVar4 = iVar4 + 1;
    }
    if (iVar4 == *(int *)((long)in_RDI + 0x50)) {
      bit_array_destroy((void *)0x85646e);
      return 0;
    }
    pDVar3 = dumb_it_init_sigrenderer
                       ((DUMB_IT_SIGDATA *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),
                        (int)((ulong)array >> 0x20),(int)array);
    if (pDVar3 == (DUMB_IT_SIGRENDERER *)0x0) {
      bit_array_destroy((void *)0x856379);
      return -1;
    }
    pDVar3->callbacks->loop = dumb_it_callback_terminate;
    pDVar3->callbacks->xm_speed_zero = dumb_it_callback_terminate;
    pDVar3->callbacks->global_volume_zero = dumb_it_callback_terminate;
    in_stack_ffffffffffffffd8 = 0;
    do {
      iVar2 = it_sigrenderer_get_samples
                        ((sigrenderer_t *)
                         CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),in_RDI,
                         (double)in_RSI,(int32)((ulong)in_RDX >> 0x20),
                         (sample_t_conflict **)CONCAT44(iVar4,in_stack_ffffffffffffffd8));
      in_stack_ffffffffffffffd8 = iVar2 + in_stack_ffffffffffffffd8;
      if (iVar2 < 0x1e0000) break;
    } while (in_stack_ffffffffffffffd8 < 0x1c200000);
    iVar1 = (*in_RSI)(in_RDX,iVar4,in_stack_ffffffffffffffd8);
    if (iVar1 < 0) {
      return -1;
    }
    bit_array_merge(in_RDX,(void *)CONCAT44(iVar4,in_stack_ffffffffffffffd8),(size_t)array);
    _dumb_it_end_sigrenderer(array);
  } while( true );
}

Assistant:

int DUMBEXPORT dumb_it_scan_for_playable_orders(DUMB_IT_SIGDATA *sigdata, dumb_scan_callback callback, void * callback_data)
{
	int n;
	int32 length;
	void * ba_played;
	DUMB_IT_SIGRENDERER * sigrenderer;
	
	if (!sigdata->n_orders || !sigdata->order) return -1;

	ba_played = bit_array_create(sigdata->n_orders * 256);
	if (!ba_played) return -1;

	/* Skip the first order, it should always be played */
	for (n = 1; n < sigdata->n_orders; n++) {
		if ((sigdata->order[n] >= sigdata->n_patterns) ||
			(is_pattern_silent(&sigdata->pattern[sigdata->order[n]], n) > 1))
			bit_array_set(ba_played, n * 256);
	}

	for (;;) {
		for (n = 0; n < sigdata->n_orders; n++) {
			if (!bit_array_test_range(ba_played, n * 256, 256)) break;
		}

		if (n == sigdata->n_orders) break;

		sigrenderer = dumb_it_init_sigrenderer(sigdata, 0, n);
		if (!sigrenderer) {
			bit_array_destroy(ba_played);
			return -1;
		}
		sigrenderer->callbacks->loop = &dumb_it_callback_terminate;
		sigrenderer->callbacks->xm_speed_zero = &dumb_it_callback_terminate;
		sigrenderer->callbacks->global_volume_zero = &dumb_it_callback_terminate;

		length = 0;

		for (;;) {
			int32 l;

			l = it_sigrenderer_get_samples(sigrenderer, 0, 1.0f, IT_CHECKPOINT_INTERVAL, NULL);
			length += l;
			if (l < IT_CHECKPOINT_INTERVAL || length >= FUCKIT_THRESHOLD) {
				/* SONG OVA! */
				break;
			}
		}

		if ((*callback)(callback_data, n, length) < 0) return -1;

		bit_array_merge(ba_played, sigrenderer->played, 0);

		_dumb_it_end_sigrenderer(sigrenderer);
	}

	bit_array_destroy(ba_played);

	return 0;
}